

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O0

void __thiscall
itlib::small_vector<int,_4UL,_0UL,_std::allocator<int>_>::clear
          (small_vector<int,_4UL,_0UL,_std::allocator<int>_> *this)

{
  allocator_type *__a;
  small_vector<int,_4UL,_0UL,_std::allocator<int>_> *in_RDI;
  pointer p;
  
  for (__a = (allocator_type *)in_RDI->m_begin; __a != (allocator_type *)in_RDI->m_end;
      __a = __a + 4) {
    get_alloc(in_RDI);
    std::allocator_traits<std::allocator<int>_>::destroy<int>(__a,(int *)in_RDI);
  }
  in_RDI->m_end = in_RDI->m_begin;
  return;
}

Assistant:

void clear() noexcept
    {
        for (auto p = m_begin; p != m_end; ++p)
        {
            atraits::destroy(get_alloc(), p);
        }

        if (RevertToStaticSize > 0)
        {
            m_begin = m_end = static_begin_ptr();
            m_capacity = StaticCapacity;
        }
        else
        {
            m_end = m_begin;
        }
    }